

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifier.cpp
# Opt level: O2

void meshopt::quadricAdd(Quadric *Q,Quadric *R)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = R->a11;
  fVar6 = R->a22;
  fVar7 = R->a10;
  Q->a00 = Q->a00 + R->a00;
  Q->a11 = Q->a11 + fVar5;
  Q->a22 = Q->a22 + fVar6;
  Q->a10 = Q->a10 + fVar7;
  fVar5 = R->a21;
  fVar6 = R->b0;
  fVar7 = R->b1;
  Q->a20 = R->a20 + Q->a20;
  Q->a21 = fVar5 + Q->a21;
  Q->b0 = fVar6 + Q->b0;
  Q->b1 = fVar7 + Q->b1;
  uVar1 = R->b2;
  uVar3 = R->c;
  uVar2 = Q->b2;
  uVar4 = Q->c;
  Q->b2 = (float)uVar2 + (float)uVar1;
  Q->c = (float)uVar4 + (float)uVar3;
  Q->w = R->w + Q->w;
  return;
}

Assistant:

static void quadricAdd(Quadric& Q, const Quadric& R)
{
	Q.a00 += R.a00;
	Q.a11 += R.a11;
	Q.a22 += R.a22;
	Q.a10 += R.a10;
	Q.a20 += R.a20;
	Q.a21 += R.a21;
	Q.b0 += R.b0;
	Q.b1 += R.b1;
	Q.b2 += R.b2;
	Q.c += R.c;
	Q.w += R.w;
}